

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O3

void tablerehash(TString **vect,int osize,int nsize)

{
  TString *pTVar1;
  TString *pTVar2;
  ulong uVar3;
  uint uVar4;
  
  if (osize < nsize) {
    memset(vect + osize,0,(ulong)(uint)(~osize + nsize) * 8 + 8);
  }
  if (0 < osize) {
    uVar3 = 0;
    do {
      pTVar1 = vect[uVar3];
      vect[uVar3] = (TString *)0x0;
      while (pTVar1 != (TString *)0x0) {
        pTVar2 = (pTVar1->u).hnext;
        uVar4 = pTVar1->hash & nsize - 1U;
        pTVar1->u = *(anon_union_8_2_b887aad4_for_u *)(vect + uVar4);
        vect[uVar4] = pTVar1;
        pTVar1 = pTVar2;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)osize);
  }
  return;
}

Assistant:

static void tablerehash (TString **vect, int osize, int nsize) {
  int i;
  for (i = osize; i < nsize; i++)  /* clear new elements */
    vect[i] = NULL;
  for (i = 0; i < osize; i++) {  /* rehash old part of the array */
    TString *p = vect[i];
    vect[i] = NULL;
    while (p) {  /* for each string in the list */
      TString *hnext = p->u.hnext;  /* save next */
      unsigned int h = lmod(p->hash, nsize);  /* new position */
      p->u.hnext = vect[h];  /* chain it into array */
      vect[h] = p;
      p = hnext;
    }
  }
}